

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv_signal_init(uv_loop_t *loop,uv_signal_t *handle)

{
  long in_RSI;
  long in_RDI;
  int err;
  uv_loop_t *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = uv__signal_loop_once_init(in_stack_ffffffffffffffd8);
  if (local_4 == 0) {
    *(long *)(in_RSI + 0x10) = in_RDI;
    *(undefined4 *)(in_RSI + 0x18) = 0x10;
    *(undefined4 *)(in_RSI + 0x30) = 0x2000;
    *(long *)(in_RSI + 0x20) = in_RDI + 0x10;
    *(undefined8 *)(in_RSI + 0x28) = *(undefined8 *)(in_RDI + 0x18);
    **(long **)(in_RSI + 0x28) = in_RSI + 0x20;
    *(long *)(in_RDI + 0x18) = in_RSI + 0x20;
    *(undefined8 *)(in_RSI + 0x38) = 0;
    *(undefined4 *)(in_RSI + 0x48) = 0;
    *(undefined4 *)(in_RSI + 0x70) = 0;
    *(undefined4 *)(in_RSI + 0x74) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int uv_signal_init(uv_loop_t* loop, uv_signal_t* handle) {
  int err;

  err = uv__signal_loop_once_init(loop);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*) handle, UV_SIGNAL);
  handle->signum = 0;
  handle->caught_signals = 0;
  handle->dispatched_signals = 0;

  return 0;
}